

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b_prov.c
# Opt level: O0

int ossl_blake2b_final(uchar *md,BLAKE2B_CTX *c)

{
  size_t sVar1;
  BLAKE2B_CTX *in_RSI;
  undefined1 *in_RDI;
  int i;
  int iter;
  uint8_t *target;
  uint8_t outbuffer [64];
  size_t in_stack_000000b0;
  uint8_t *in_stack_000000b8;
  BLAKE2B_CTX *in_stack_000000c0;
  int local_68;
  undefined1 *local_60;
  undefined1 local_58 [72];
  BLAKE2B_CTX *local_10;
  undefined1 *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(local_58,0,0x40);
  local_60 = local_58;
  sVar1 = local_10->outlen;
  if ((local_10->outlen & 7) == 0) {
    local_60 = local_8;
  }
  blake2b_set_lastblock(local_10);
  memset(local_10->buf + local_10->buflen,0,0x80 - local_10->buflen);
  blake2b_compress(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
  for (local_68 = 0; local_68 < (int)(sVar1 + 7 >> 3); local_68 = local_68 + 1) {
    store64(local_60 + (long)local_68 * 8,local_10->h[local_68]);
  }
  if (local_60 != local_8) {
    memcpy(local_8,local_60,local_10->outlen);
  }
  OPENSSL_cleanse(local_10,0xf0);
  return 1;
}

Assistant:

int ossl_blake2b_final(unsigned char *md, BLAKE2B_CTX *c)
{
    uint8_t outbuffer[BLAKE2B_OUTBYTES] = {0};
    uint8_t *target = outbuffer;
    int iter = (c->outlen + 7) / 8;
    int i;

    /* Avoid writing to the temporary buffer if possible */
    if ((c->outlen % sizeof(c->h[0])) == 0)
        target = md;

    blake2b_set_lastblock(c);
    /* Padding */
    memset(c->buf + c->buflen, 0, sizeof(c->buf) - c->buflen);
    blake2b_compress(c, c->buf, c->buflen);

    /* Output full hash to buffer */
    for (i = 0; i < iter; ++i)
        store64(target + sizeof(c->h[i]) * i, c->h[i]);

    if (target != md)
        memcpy(md, target, c->outlen);

    OPENSSL_cleanse(c, sizeof(BLAKE2B_CTX));
    return 1;
}